

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::JunitReporter(JunitReporter *this,ReporterConfig *config)

{
  IConfig *pIVar1;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  (this->super_SharedImpl<Catch::IReporter>).m_rc = 0;
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__JunitReporter_00161378;
  (this->m_config).m_stream = config->m_stream;
  pIVar1 = (config->m_fullConfig).m_p;
  (this->m_config).m_fullConfig.m_p = pIVar1;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[2])();
  }
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"AllTests","");
  (this->m_testSuiteStats).m_disabledCount = 0;
  (this->m_testSuiteStats).m_errorsCount = 0;
  (this->m_testSuiteStats).m_testsCount = 0;
  (this->m_testSuiteStats).m_failuresCount = 0;
  (this->m_testSuiteStats).m_timeInSeconds = 0.0;
  (this->m_testSuiteStats).m_name._M_dataplus._M_p =
       (pointer)&(this->m_testSuiteStats).m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_testSuiteStats).m_name,local_40,local_40 + local_38);
  (this->m_testSuiteStats).m_testCaseStats.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_testSuiteStats).m_testCaseStats.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_testSuiteStats).m_testCaseStats.
  super__Vector_base<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  this->m_currentStats = &this->m_testSuiteStats;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_statsForSuites).
  super__Vector_base<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_currentTestCaseStats).
  super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_currentTestCaseStats).
  super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_currentTestCaseStats).
  super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdOut);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->m_stdErr);
  return;
}

Assistant:

JunitReporter( ReporterConfig const& config )
        :   m_config( config ),
            m_testSuiteStats( "AllTests" ),
            m_currentStats( &m_testSuiteStats )
        {}